

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_with(REF_CELL ref_cell,REF_INT *nodes,REF_INT *cell)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  REF_INT ncandidate;
  REF_INT ntarget;
  REF_INT orig [27];
  REF_INT candidate [27];
  REF_INT target [27];
  REF_INT local_194;
  uint local_190;
  uint local_18c;
  REF_INT local_188 [28];
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  *cell = -1;
  uVar4 = ref_sort_unique_int(ref_cell->node_per,nodes,(REF_INT *)&local_18c,local_a8);
  if (uVar4 == 0) {
    iVar1 = *nodes;
    if ((long)iVar1 < 0) {
      return 5;
    }
    pRVar2 = ref_cell->ref_adj;
    if (pRVar2->nnode <= iVar1) {
      return 5;
    }
    lVar8 = (long)pRVar2->first[iVar1];
    if (lVar8 == -1) {
      return 5;
    }
    local_194 = pRVar2->item[lVar8].ref;
    uVar4 = ref_cell_nodes(ref_cell,local_194,local_188);
    if (uVar4 == 0) {
      do {
        uVar4 = ref_sort_unique_int(ref_cell->node_per,local_188,(REF_INT *)&local_190,local_118);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x4ac,"ref_cell_with",(ulong)uVar4,"canonical");
          return uVar4;
        }
        if (local_18c == local_190) {
          if ((int)local_18c < 1) {
            uVar4 = 0;
          }
          else {
            uVar6 = 0;
            uVar4 = 0;
            do {
              uVar4 = uVar4 + (local_a8[uVar6] == local_118[uVar6]);
              uVar6 = uVar6 + 1;
            } while (local_18c != uVar6);
          }
          if (local_18c == uVar4) {
            *cell = local_194;
            return 0;
          }
        }
        pRVar3 = ref_cell->ref_adj->item;
        lVar8 = (long)pRVar3[(int)lVar8].next;
        if (lVar8 == -1) {
          return 5;
        }
        local_194 = pRVar3[lVar8].ref;
        uVar4 = ref_cell_nodes(ref_cell,local_194,local_188);
      } while (uVar4 == 0);
    }
    pcVar7 = "get orig";
    uVar5 = 0x4a9;
  }
  else {
    pcVar7 = "canonical";
    uVar5 = 0x4a6;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar5,
         "ref_cell_with",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_with(REF_CELL ref_cell, REF_INT *nodes,
                                 REF_INT *cell) {
  REF_INT item, ref, node, same;
  REF_INT ntarget, target[REF_CELL_MAX_SIZE_PER];
  REF_INT ncandidate, candidate[REF_CELL_MAX_SIZE_PER];
  REF_INT orig[REF_CELL_MAX_SIZE_PER];

  (*cell) = REF_EMPTY;

  RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), nodes, &ntarget, target),
      "canonical");

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), nodes[0], item, ref) {
    RSS(ref_cell_nodes(ref_cell, ref, orig), "get orig");
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), orig, &ncandidate,
                            candidate),
        "canonical");
    if (ntarget == ncandidate) {
      same = 0;
      for (node = 0; node < ntarget; node++)
        if (target[node] == candidate[node]) same++;
      if (ntarget == same) {
        (*cell) = ref;
        return REF_SUCCESS;
      }
    }
  }

  return REF_NOT_FOUND;
}